

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  format_specs *pfVar2;
  num_writer f;
  wchar_t wVar3;
  int iVar4;
  int iVar5;
  int num_digits;
  long lVar6;
  int iVar7;
  string_view prefix;
  string groups;
  locale_ref in_stack_ffffffffffffff58;
  locale_ref in_stack_ffffffffffffff60;
  undefined4 uStack_5c;
  long local_58;
  long local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  grouping_impl<wchar_t>(in_stack_ffffffffffffff60);
  if (local_50 == 0) {
    on_dec(this);
  }
  else {
    wVar3 = thousands_sep_impl<wchar_t>(in_stack_ffffffffffffff58);
    if (wVar3 == L'\0') {
      on_dec(this);
    }
    else {
      iVar4 = count_digits(this->abs_value);
      num_digits = (int)local_50 + iVar4;
      iVar5 = iVar4;
      for (lVar6 = 0; local_50 != lVar6; lVar6 = lVar6 + 1) {
        cVar1 = *(char *)(local_58 + lVar6);
        iVar7 = iVar5 - cVar1;
        if ((iVar7 == 0 || iVar5 < cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          num_digits = iVar4 + (int)lVar6;
          if (local_50 != lVar6) goto LAB_001470f5;
          break;
        }
        iVar5 = iVar7;
      }
      num_digits = (iVar5 + -1) / (int)*(char *)(local_58 + -1 + local_50) + num_digits;
LAB_001470f5:
      pfVar2 = this->specs;
      local_38._0_4_ = pfVar2->width;
      local_38._4_4_ = pfVar2->precision;
      uStack_30._0_1_ = pfVar2->type;
      uStack_30._1_3_ = *(undefined3 *)&pfVar2->field_0x9;
      uStack_30._4_4_ = (pfVar2->fill).data_[0];
      local_28 = *(undefined8 *)((pfVar2->fill).data_ + 1);
      uStack_20 = *(undefined8 *)((pfVar2->fill).data_ + 3);
      f._20_4_ = uStack_5c;
      f.sep = wVar3;
      f.size = num_digits;
      f.abs_value = this->abs_value;
      f.groups = (string *)&local_58;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,
                 *pfVar2,f);
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }